

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall ymfm::ym2608::clock_fm_and_adpcm(ym2608 *this)

{
  output_data *output;
  uint8_t uVar1;
  uint32_t chanmask;
  ulong uVar2;
  
  uVar1 = this->m_irq_enable;
  uVar2 = fm_engine_base<ymfm::opn_registers_base<true>_>::clock
                    ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  if ((uVar2 & 3) == 0) {
    adpcm_a_engine::clock(&this->m_adpcm_a);
  }
  chanmask = 7;
  if ((char)uVar1 < '\0') {
    chanmask = 0x3f;
  }
  adpcm_b_engine::clock(&this->m_adpcm_b);
  output = &this->m_last_fm;
  *(undefined8 *)(this->m_last_fm).data = 0;
  fm_engine_base<ymfm::opn_registers_base<true>_>::output
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,output,1,0x7fff,chanmask
            );
  adpcm_a_engine::output<2>(&this->m_adpcm_a,output,0x3f);
  adpcm_b_engine::output<2>(&this->m_adpcm_b,output,1);
  ymfm_output<2>::clamp16(output);
  return;
}

Assistant:

void ym2608::clock_fm_and_adpcm()
{
	// top bit of the IRQ enable flags controls 3-channel vs 6-channel mode
	uint32_t fmmask = bitfield(m_irq_enable, 7) ? 0x3f : 0x07;

	// clock the system
	uint32_t env_counter = m_fm.clock(fm_engine::ALL_CHANNELS);

	// clock the ADPCM-A engine on every envelope cycle
	// (channels 4 and 5 clock every 2 envelope clocks)
	if (bitfield(env_counter, 0, 2) == 0)
		m_adpcm_a.clock(bitfield(env_counter, 2) ? 0x0f : 0x3f);

	// clock the ADPCM-B engine every cycle
	m_adpcm_b.clock();

	// update the FM content; OPNA is 13-bit with no intermediate clipping
	m_fm.output(m_last_fm.clear(), 1, 32767, fmmask);

	// mix in the ADPCM and clamp
	m_adpcm_a.output(m_last_fm, 0x3f);
	m_adpcm_b.output(m_last_fm, 1);
	m_last_fm.clamp16();
}